

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O1

void duckdb_je_buf_writer_terminate(tsdn_t *tsdn,buf_writer_t *buf_writer)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  undefined8 *puVar3;
  char *ptr;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  rtree_leaf_elm_t *prVar6;
  rtree_leaf_elm_t *in_RDX;
  rtree_leaf_elm_t *extraout_RDX;
  rtree_leaf_elm_t *extraout_RDX_00;
  rtree_leaf_elm_t *extraout_RDX_01;
  rtree_leaf_elm_t *extraout_RDX_02;
  rtree_leaf_elm_t *extraout_RDX_03;
  rtree_leaf_elm_t *extraout_RDX_04;
  rtree_leaf_elm_t *extraout_RDX_05;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_leaf_elm_t *prVar10;
  uint uVar11;
  rtree_ctx_t *prVar12;
  bool bVar13;
  rtree_ctx_t local_1b0;
  
  if (buf_writer->buf != (char *)0x0) {
    buf_writer->buf[buf_writer->buf_end] = '\0';
    (*buf_writer->write_cb)(buf_writer->cbopaque,buf_writer->buf);
    buf_writer->buf_end = 0;
    in_RDX = extraout_RDX;
  }
  if ((buf_writer->internal_buf == true) && (ptr = buf_writer->buf, ptr != (char *)0x0)) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_00;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar11 = (uint)((ulong)ptr >> 0x1e) & 0xf;
    prVar10 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
    puVar3 = (undefined8 *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    prVar6 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (prVar6 == prVar10) {
      prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = in_RDX;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar8 = prVar12->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar10) {
        uVar7 = 0;
        bVar13 = false;
      }
      else {
        uVar7 = 0;
        prVar9 = prVar8;
        do {
          if (uVar7 == 6) {
            bVar13 = true;
            in_RDX = (rtree_leaf_elm_t *)0x6;
            goto LAB_01c6d4d1;
          }
          prVar8 = prVar9 + 1;
          uVar7 = uVar7 + 1;
          prVar2 = prVar9 + 1;
          prVar9 = prVar8;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar10);
        bVar13 = 6 < uVar7;
      }
      prVar5 = prVar8->leaf;
      in_RDX = (rtree_leaf_elm_t *)(uVar7 * 0x10);
      prVar8->leafkey = prVar12->l2_cache[uVar7].leafkey;
      prVar8->leaf = prVar12->l2_cache[uVar7].leaf;
      prVar12->l2_cache[uVar7].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = prVar5;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c6d4d1:
      if (bVar13) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,
                            false);
        in_RDX = extraout_RDX_03;
      }
    }
    pvVar4 = duckdb_je_arenas
             [*(uint *)(((long)(prVar6->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff
             ].repr;
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_01;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar3 = (undefined8 *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    prVar6 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (prVar6 == prVar10) {
      prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = in_RDX;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar8 = prVar12->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar10) {
        uVar7 = 0;
        bVar13 = false;
      }
      else {
        uVar7 = 0;
        prVar9 = prVar8;
        do {
          if (uVar7 == 6) {
            bVar13 = true;
            in_RDX = (rtree_leaf_elm_t *)0x6;
            goto LAB_01c6d556;
          }
          prVar8 = prVar9 + 1;
          uVar7 = uVar7 + 1;
          prVar2 = prVar9 + 1;
          prVar9 = prVar8;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar10);
        bVar13 = 6 < uVar7;
      }
      prVar5 = prVar8->leaf;
      in_RDX = (rtree_leaf_elm_t *)(uVar7 * 0x10);
      prVar8->leafkey = prVar12->l2_cache[uVar7].leafkey;
      prVar8->leaf = prVar12->l2_cache[uVar7].leaf;
      prVar12->l2_cache[uVar7].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = prVar5;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c6d556:
      if (bVar13) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,
                            false);
        in_RDX = extraout_RDX_04;
      }
    }
    LOCK();
    plVar1 = (long *)((long)pvVar4 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[(ulong)(prVar6->le_bits).repr >> 0x30];
    UNLOCK();
    if (tsdn == (tsdn_t *)0x0) {
      prVar12 = &local_1b0;
      duckdb_je_rtree_ctx_data_init(prVar12);
      in_RDX = extraout_RDX_02;
    }
    else {
      prVar12 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    puVar3 = (undefined8 *)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    prVar6 = *(rtree_leaf_elm_t **)((long)&prVar12->cache[0].leafkey + (ulong)(uVar11 << 4));
    if (prVar6 == prVar10) {
      prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar3[1]);
    }
    else if ((rtree_leaf_elm_t *)prVar12->l2_cache[0].leafkey == prVar10) {
      in_RDX = prVar12->l2_cache[0].leaf;
      prVar12->l2_cache[0].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = in_RDX;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(in_RDX->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
    }
    else {
      prVar8 = prVar12->l2_cache + 1;
      if ((rtree_leaf_elm_t *)prVar12->l2_cache[1].leafkey == prVar10) {
        uVar7 = 0;
        bVar13 = false;
      }
      else {
        uVar7 = 0;
        prVar9 = prVar8;
        do {
          if (uVar7 == 6) {
            bVar13 = true;
            in_RDX = (rtree_leaf_elm_t *)0x6;
            goto LAB_01c6d5db;
          }
          prVar8 = prVar9 + 1;
          uVar7 = uVar7 + 1;
          prVar2 = prVar9 + 1;
          prVar9 = prVar8;
        } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar10);
        bVar13 = 6 < uVar7;
      }
      prVar5 = prVar8->leaf;
      in_RDX = (rtree_leaf_elm_t *)(uVar7 * 0x10);
      prVar8->leafkey = prVar12->l2_cache[uVar7].leafkey;
      prVar8->leaf = prVar12->l2_cache[uVar7].leaf;
      prVar12->l2_cache[uVar7].leafkey = (uintptr_t)prVar6;
      prVar12->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)puVar3[1];
      *puVar3 = prVar10;
      puVar3[1] = prVar5;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_01c6d5db:
      if (bVar13) {
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                           (tsdn,&duckdb_je_arena_emap_global.rtree,prVar12,(uintptr_t)ptr,true,
                            false);
        in_RDX = extraout_RDX_05;
      }
    }
    if (((ulong)(prVar6->le_bits).repr & 1) == 0) {
      arena_dalloc_large_no_tcache(tsdn,ptr,(szind_t)in_RDX);
    }
    else {
      duckdb_je_arena_dalloc_small(tsdn,ptr);
    }
  }
  return;
}

Assistant:

void
buf_writer_terminate(tsdn_t *tsdn, buf_writer_t *buf_writer) {
	buf_writer_assert(buf_writer);
	buf_writer_flush(buf_writer);
	if (buf_writer->internal_buf) {
		buf_writer_free_internal_buf(tsdn, buf_writer->buf);
	}
}